

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::CornerCoordinates
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,
          TPZFMatrix<double> *coord)

{
  TPZGeoNode *pTVar1;
  int j;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 0;
  do {
    pTVar1 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(((this->super_TPZGeoEl).fMesh)->fNodeVec).
                         super_TPZChunkVector<TPZGeoNode,_10>,
                        (this->fGeo).super_TPZGeoQuad.
                        super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[lVar4]);
    lVar2 = 0;
    do {
      if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(REAL *)((long)coord->fElem +
               lVar2 * 8 + (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar3) =
           pTVar1->fCoord[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 8;
    if (lVar4 == 4) {
      return;
    }
  } while( true );
}

Assistant:

inline void TPZGeoElRefLess<TGeo>::CornerCoordinates(TPZFMatrix<REAL> &coord) const
{
    for(int i=0;i<TGeo::NNodes;i++) {
        auto &np = fMesh->NodeVec()[fGeo.fNodeIndexes[i]];
        for(int j=0;j<3;j++) {
            coord(j,i) = np.Coord(j);
        }
    }
}